

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archive.cpp
# Opt level: O3

ostream * operator<<(ostream *str,ArchiveEntry *data)

{
  ostream *poVar1;
  bool bVar2;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (str,(data->GroupName)._M_dataplus._M_p,(data->GroupName)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (str,(data->RunName)._M_dataplus._M_p,(data->RunName)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  bVar2 = SUB81(str,0);
  poVar1 = std::ostream::_M_insert<bool>(bVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = std::ostream::_M_insert<long>((long)str);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = std::ostream::_M_insert<double>(data->ExperimentValueScale);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)str);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)str);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = std::ostream::_M_insert<double>(data->AverageBaseline);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = std::ostream::_M_insert<double>(data->MinBaseline);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)str);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  operator<<(str,&data->MinStats);
  std::__ostream_insert<char,std::char_traits<char>>(str,",",1);
  poVar1 = std::ostream::_M_insert<double>(data->MaxBaseline);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)str);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  operator<<(str,&data->MaxStats);
  std::__ostream_insert<char,std::char_traits<char>>(str,",",1);
  poVar1 = std::ostream::_M_insert<double>(data->CurrentBaseline);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)str);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  operator<<(str,&data->CurrentStats);
  std::ios::widen((char)*(undefined8 *)(*(long *)str + -0x18) + bVar2);
  std::ostream::put(bVar2);
  std::ostream::flush();
  return str;
}

Assistant:

std::ostream& operator<<(std::ostream& str, ArchiveEntry const& data)
{
	str << data.GroupName << ",";
	str << data.RunName << ",";
	str << data.Failure << ",";
	str << data.ExperimentValue << ",";
	str << data.ExperimentValueScale << ",";
	str << data.FirstRanDate << ",";
	str << data.TotalSamplesCollected << ",";
	str << data.AverageBaseline << ",";
	str << data.MinBaseline << ",";
	str << data.MinBaseline_TimeSinceEpoch << ",";
	str << data.MinStats << ",";
	str << data.MaxBaseline << ",";
	str << data.MaxBaseline_TimeSinceEpoch << ",";
	str << data.MaxStats << ",";
	str << data.CurrentBaseline << ",";
	str << data.CurrentBaseline_TimeSinceEpoch << ",";
	str << data.CurrentStats << std::endl;
	return str;
}